

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

int tlstran_dialer_getopt(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_stream_dialer_get(*(nng_stream_dialer **)((long)arg + 0x58),name,buf,szp,t);
  if (iVar1 == 9) {
    iVar1 = nni_getopt(tlstran_ep_options,name,arg,buf,szp,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
tlstran_dialer_getopt(
    void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	int         rv;
	tlstran_ep *ep = arg;

	rv = nni_stream_dialer_get(ep->dialer, name, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_getopt(tlstran_ep_options, name, ep, buf, szp, t);
	}
	return (rv);
}